

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall QtPrivate::QGenericArrayOps<QString>::eraseFirst(QGenericArrayOps<QString> *this)

{
  QString **ppQVar1;
  qsizetype *pqVar2;
  
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            (&((this->super_QArrayDataPointer<QString>).ptr)->d);
  ppQVar1 = &(this->super_QArrayDataPointer<QString>).ptr;
  *ppQVar1 = *ppQVar1 + 1;
  pqVar2 = &(this->super_QArrayDataPointer<QString>).size;
  *pqVar2 = *pqVar2 + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }